

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse2_128_64.c
# Opt level: O0

parasail_result_t *
parasail_nw_table_striped_sse2_128_64
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  parasail_profile_t *profile_00;
  undefined4 in_register_00000084;
  undefined8 uVar1;
  parasail_result_t *result;
  parasail_profile_t *profile;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  int s1Len_local;
  char *s1_local;
  
  uVar1 = CONCAT44(in_register_00000084,open);
  if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_sse2_128_64","s2",uVar1,gap,0,0);
    s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_striped_sse2_128_64","s2Len",uVar1,gap
            ,0,0);
    s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_striped_sse2_128_64","open",uVar1,gap
            ,0,0);
    s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_striped_sse2_128_64","gap",uVar1,gap,
            0,0);
    s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_sse2_128_64","matrix",uVar1,gap,0,
            0);
    s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_sse2_128_64","s1",uVar1,gap,0,
                0);
        return (parasail_result_t *)0x0;
      }
      if (s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_striped_sse2_128_64","s1Len",uVar1
                ,gap,0,0);
        return (parasail_result_t *)0x0;
      }
    }
    profile_00 = parasail_profile_create_sse_128_64(s1,s1Len,matrix);
    if (profile_00 == (parasail_profile_t *)0x0) {
      s1_local = (char *)0x0;
    }
    else {
      s1_local = (char *)parasail_nw_table_striped_profile_sse2_128_64(profile_00,s2,s2Len,open,gap)
      ;
      parasail_profile_free(profile_00);
    }
  }
  return (parasail_result_t *)s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_profile_t *profile = NULL;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
        PARASAIL_CHECK_GT0(s1Len);
    }

    /* initialize local variables */
    profile = parasail_profile_create_sse_128_64(s1, s1Len, matrix);
    if (!profile) return NULL;
    result = PNAME(profile, s2, s2Len, open, gap);

    parasail_profile_free(profile);

    return result;
}